

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

void cvRestore(CVodeMem cv_mem,sunrealtype saved_t)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  cv_mem->cv_tn = saved_t;
  uVar2 = (ulong)(uint)cv_mem->cv_q;
  if (0 < cv_mem->cv_q) {
    lVar3 = 1;
    do {
      lVar4 = (long)(int)uVar2;
      do {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_zn[lVar4 + -1],
                     cv_mem->cv_zn[lVar4],cv_mem->cv_zn[lVar4 + -1]);
        bVar1 = lVar3 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar1);
      uVar2 = (ulong)cv_mem->cv_q;
      bVar1 = lVar3 < (long)uVar2;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  if ((cv_mem->cv_quadr != 0) && (uVar2 = (ulong)(uint)cv_mem->cv_q, 0 < cv_mem->cv_q)) {
    lVar3 = 1;
    do {
      lVar4 = (long)(int)uVar2;
      do {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_znQ[lVar4 + -1],
                     cv_mem->cv_znQ[lVar4],cv_mem->cv_znQ[lVar4 + -1]);
        bVar1 = lVar3 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar1);
      uVar2 = (ulong)cv_mem->cv_q;
      bVar1 = lVar3 < (long)uVar2;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  if ((cv_mem->cv_sensi != 0) && (uVar2 = (ulong)(uint)cv_mem->cv_q, 0 < cv_mem->cv_q)) {
    lVar3 = 1;
    do {
      lVar4 = (long)(int)uVar2;
      do {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_Ns,cv_mem->cv_znS[lVar4 + -1],
                   cv_mem->cv_znS[lVar4]);
        bVar1 = lVar3 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar1);
      uVar2 = (ulong)cv_mem->cv_q;
      bVar1 = lVar3 < (long)uVar2;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  if ((cv_mem->cv_quadr_sensi != 0) && (uVar2 = (ulong)(uint)cv_mem->cv_q, 0 < cv_mem->cv_q)) {
    lVar3 = 1;
    do {
      lVar4 = (long)(int)uVar2;
      do {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_Ns,cv_mem->cv_znQS[lVar4 + -1],
                   cv_mem->cv_znQS[lVar4]);
        bVar1 = lVar3 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar1);
      uVar2 = (ulong)cv_mem->cv_q;
      bVar1 = lVar3 < (long)uVar2;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void cvRestore(CVodeMem cv_mem, sunrealtype saved_t)
{
  int j, k;

  cv_mem->cv_tn = saved_t;
  for (k = 1; k <= cv_mem->cv_q; k++)
  {
    for (j = cv_mem->cv_q; j >= k; j--)
    {
      N_VLinearSum(ONE, cv_mem->cv_zn[j - 1], -ONE, cv_mem->cv_zn[j],
                   cv_mem->cv_zn[j - 1]);
    }
  }

  if (cv_mem->cv_quadr)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        N_VLinearSum(ONE, cv_mem->cv_znQ[j - 1], -ONE, cv_mem->cv_znQ[j],
                     cv_mem->cv_znQ[j - 1]);
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[j - 1],
                                      -ONE, cv_mem->cv_znS[j],
                                      cv_mem->cv_znS[j - 1]);
      }
    }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znQS[j - 1],
                                      -ONE, cv_mem->cv_znQS[j],
                                      cv_mem->cv_znQS[j - 1]);
      }
    }
  }
}